

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BVHLoader::InternReadFile
          (BVHLoader *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  int iVar1;
  undefined4 extraout_var;
  size_type __new_size;
  DeadlyImportError *pDVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  SkeletonMeshBuilder meshBuilder;
  long *plVar2;
  
  std::__cxx11::string::_M_assign((string *)&this->mFileName);
  std::__cxx11::string::string((string *)&meshBuilder,"rb",(allocator *)&local_a0);
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,
                     meshBuilder.mVertices.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string((string *)&meshBuilder);
  if (plVar2 == (long *)0x0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a0,"Failed to open file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meshBuilder
                   ,&local_a0,".");
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)&meshBuilder);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  __new_size = (**(code **)(*plVar2 + 0x30))(plVar2);
  if (__new_size != 0) {
    std::vector<char,_std::allocator<char>_>::resize(&this->mBuffer,__new_size);
    (**(code **)(*plVar2 + 0x10))
              (plVar2,(this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,1);
    (this->mReader)._M_current =
         (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->mLine = 1;
    ReadStructure(this,pScene);
    if (this->noSkeletonMesh == false) {
      SkeletonMeshBuilder::SkeletonMeshBuilder(&meshBuilder,pScene,(aiNode *)0x0,false);
      SkeletonMeshBuilder::~SkeletonMeshBuilder(&meshBuilder);
    }
    CreateAnimation(this,pScene);
    (**(code **)(*plVar2 + 8))(plVar2);
    return;
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&meshBuilder,"File is too small.",(allocator *)&local_a0);
  DeadlyImportError::DeadlyImportError(pDVar3,(string *)&meshBuilder);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BVHLoader::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    mFileName = pFile;

    // read file into memory
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open file " + pFile + ".");

    size_t fileSize = file->FileSize();
    if( fileSize == 0)
        throw DeadlyImportError( "File is too small.");

    mBuffer.resize( fileSize);
    file->Read( &mBuffer.front(), 1, fileSize);

    // start reading
    mReader = mBuffer.begin();
    mLine = 1;
    ReadStructure( pScene);

    if (!noSkeletonMesh) {
        // build a dummy mesh for the skeleton so that we see something at least
        SkeletonMeshBuilder meshBuilder( pScene);
    }

    // construct an animation from all the motion data we read
    CreateAnimation( pScene);
}